

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall soul::AST::TypeMetaFunction::throwErrorIfUnresolved(TypeMetaFunction *this)

{
  Expression *pEVar1;
  int iVar2;
  Type TStack_28;
  
  pEVar1 = (this->source).object;
  if ((pEVar1->kind == value) &&
     (iVar2 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar2 != '\0'
     )) {
    (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&TStack_28);
    throwErrorIfUnresolved(this,&TStack_28);
    RefCountedPtr<soul::Structure>::decIfNotNull(TStack_28.structure.object);
    return;
  }
  pEVar1 = (this->source).object;
  if ((pEVar1->kind == type) &&
     (iVar2 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar2 != '\0'
     )) {
    (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&TStack_28);
    throwErrorIfUnresolved(this,&TStack_28);
    RefCountedPtr<soul::Structure>::decIfNotNull(TStack_28.structure.object);
  }
  return;
}

Assistant:

void throwErrorIfUnresolved() const
        {
            if (isResolvedAsValue (source.get()))
                throwErrorIfUnresolved (source->getResultType());
            else if (isResolvedAsType (source.get()))
                throwErrorIfUnresolved (source->resolveAsType());
        }